

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenX86.cc
# Opt level: O2

void __thiscall mcc::CodeGenX86::GenCondJump(CodeGenX86 *this,int r,TokenType type,int label)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<(this->out_,"\ttest\t");
  poVar1 = std::operator<<(poVar1,(string *)(this->kRegisters + r));
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,(string *)(this->kRegisters + r));
  std::operator<<(poVar1,"\n");
  if (type == T_AND) {
    pcVar2 = "\tje\tL";
  }
  else {
    if (type != T_OR) {
      poVar1 = std::operator<<((ostream *)&std::cerr,
                               "Internal error: unexpected operator type in logical expr");
      poVar1 = operator<<(poVar1,type);
      std::endl<char,std::char_traits<char>>(poVar1);
      exit(1);
    }
    pcVar2 = "\tjne\tL";
  }
  poVar1 = std::operator<<(this->out_,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,label);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void CodeGenX86::GenCondJump(int r, TokenType type, int label) {
  out_ << "\ttest\t" << kRegisters[r] << ", " << kRegisters[r] << "\n";
  if (type == TokenType::T_AND) {
    out_ << "\tje\tL" << label << "\n";
  } else if (type == TokenType::T_OR) {
    out_ << "\tjne\tL" << label << "\n";
  } else {
    std::cerr << "Internal error: unexpected operator type in logical expr" << type << std::endl;
    exit(1);
  }
}